

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.hh
# Opt level: O1

void std::
     __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Address*,std::vector<Address,std::allocator<Address>>>,__gnu_cxx::__ops::_Val_less_iter>
               (long *__last)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  
  lVar1 = *__last;
  uVar2 = __last[1];
  do {
    lVar3 = __last[-2];
    if (lVar1 == lVar3) {
      bVar4 = uVar2 < (ulong)__last[-1];
LAB_00291f45:
      if (!bVar4) goto LAB_00291f5b;
    }
    else if (lVar1 != 0) {
      if (lVar1 == -1) goto LAB_00291f5b;
      if (lVar3 != -1) {
        if (lVar3 != 0) {
          bVar4 = *(int *)(lVar1 + 0x60) < *(int *)(lVar3 + 0x60);
          goto LAB_00291f45;
        }
LAB_00291f5b:
        *__last = lVar1;
        __last[1] = uVar2;
        return;
      }
    }
    *__last = lVar3;
    __last[1] = __last[-1];
    __last = __last + -2;
  } while( true );
}

Assistant:

inline Address::Address(const Address &op2) {
  base = op2.base;
  offset = op2.offset;
}